

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pivotref.cpp
# Opt level: O2

bool __thiscall duckdb::PivotColumn::Equals(PivotColumn *this,PivotColumn *other)

{
  bool bVar1;
  bool bVar2;
  const_reference this_00;
  const_reference other_00;
  idx_t i;
  ulong __n;
  
  bVar1 = ExpressionUtil::ListEquals(&this->pivot_expressions,&other->pivot_expressions);
  if ((((!bVar1) ||
       (bVar1 = ::std::operator!=(&(other->unpivot_names).
                                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ,&(this->unpivot_names).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ), bVar1)) ||
      (bVar1 = ::std::operator!=(&other->pivot_enum,&this->pivot_enum), bVar1)) ||
     ((long)(other->entries).
            super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
            super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(other->entries).
            super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
            super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
            _M_impl.super__Vector_impl_data._M_start !=
      (long)(this->entries).
            super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
            super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)(this->entries).
            super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
            super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>.
            _M_impl.super__Vector_impl_data._M_start)) {
    bVar1 = false;
  }
  else {
    __n = 0;
    do {
      bVar1 = (ulong)((long)(this->entries).
                            super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                            .
                            super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->entries).
                            super_vector<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                            .
                            super__Vector_base<duckdb::PivotColumnEntry,_std::allocator<duckdb::PivotColumnEntry>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 6) <= __n;
      if (bVar1) {
        return bVar1;
      }
      this_00 = vector<duckdb::PivotColumnEntry,_true>::get<true>(&this->entries,__n);
      other_00 = vector<duckdb::PivotColumnEntry,_true>::get<true>(&other->entries,__n);
      bVar2 = PivotColumnEntry::Equals(this_00,other_00);
      __n = __n + 1;
    } while (bVar2);
  }
  return bVar1;
}

Assistant:

bool PivotColumn::Equals(const PivotColumn &other) const {
	if (!ExpressionUtil::ListEquals(pivot_expressions, other.pivot_expressions)) {
		return false;
	}
	if (other.unpivot_names != unpivot_names) {
		return false;
	}
	if (other.pivot_enum != pivot_enum) {
		return false;
	}
	if (other.entries.size() != entries.size()) {
		return false;
	}
	for (idx_t i = 0; i < entries.size(); i++) {
		if (!entries[i].Equals(other.entries[i])) {
			return false;
		}
	}
	return true;
}